

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

ParseResult * __thiscall
cxxopts::OptionParser::parse
          (ParseResult *__return_storage_ptr__,OptionParser *this,int argc,char **argv)

{
  ParsedHashMap *pPVar1;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *this_00;
  size_type *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *text;
  element_type *peVar3;
  _Hash_node_base *p_Var4;
  key_type *__k;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ParseResult *pPVar6;
  element_type *peVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  int iVar9;
  int iVar10;
  mapped_type *pmVar11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  char *pcVar14;
  _Alloc_hider this_01;
  pointer __k_00;
  undefined8 uVar15;
  _Hash_node_base *p_Var16;
  pointer pcVar17;
  shared_ptr<cxxopts::OptionDetails> *psVar18;
  char cVar19;
  bool bVar20;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_148;
  ParseResult *local_130;
  ParseResult *parsed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  size_t hash;
  undefined1 auStack_f8 [8];
  ArguDesc argu_desc;
  size_t hash_2;
  undefined1 local_a0 [8];
  shared_ptr<cxxopts::OptionDetails> value;
  string name;
  string arg_value;
  bool local_36;
  char local_35;
  int local_34;
  bool matched;
  int current;
  
  local_34 = 1;
  __k_00 = (this->m_positional->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  parsed = (ParseResult *)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unmatched.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cVar19 = argc == 1;
  local_130 = __return_storage_ptr__;
  arg_value.field_2._8_8_ = argv;
  if (!(bool)cVar19) {
    pcVar14 = argv[1];
    iVar9 = strcmp(pcVar14,"--");
    if (iVar9 == 0) {
      local_34 = 2;
    }
    else {
      pPVar1 = &this->m_parsed;
      this_00 = &this->m_sequential;
      text = &value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      do {
        local_36 = false;
        values::parser_tool::ParseArgument((ArguDesc *)auStack_f8,pcVar14,&local_36);
        uVar15 = arg_value.field_2._8_8_;
        if (local_36 == false) {
          pcVar14 = *(char **)(arg_value.field_2._8_8_ + (long)local_34 * 8);
          if (((*pcVar14 == '-') && (pcVar14[1] != '\0')) && (this->m_allow_unrecognised == false))
          {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)text,pcVar14,(allocator<char> *)(name.field_2._M_local_buf + 8));
            throw_or_mimic<cxxopts::option_syntax_exception>((string *)text);
            if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length) {
              operator_delete(value.
                              super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi,name._M_string_length + 1);
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)text,*(char **)(uVar15 + (long)local_34 * 8),
                     (allocator<char> *)(argu_desc.value.field_2._M_local_buf + 8));
          bVar20 = __k_00 != (this->m_positional->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
          if (bVar20) {
            bVar20 = true;
            do {
              cVar12 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&this->m_options->_M_h,__k_00);
              if (cVar12.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
              }
              else {
                cVar19 = (**(code **)(**(long **)(*(long *)((long)cVar12.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                                  ._M_cur + 0x28) + 0x60) + 0x30))();
                psVar18 = (shared_ptr<cxxopts::OptionDetails> *)
                          ((long)cVar12.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                 ._M_cur + 0x28);
                if (cVar19 != '\0') {
                  parse_option(this,psVar18,__k_00,(string *)text);
                  break;
                }
                name.field_2._8_8_ =
                     ((psVar18->
                      super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->m_hash;
                pmVar11 = std::__detail::
                          _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)pPVar1,(key_type *)(name.field_2._M_local_buf + 8));
                if (pmVar11->m_count == 0) {
                  parse_option(this,psVar18,__k_00,(string *)text);
                  __k_00 = __k_00 + 1;
                  break;
                }
                __k_00 = __k_00 + 1;
              }
              bVar20 = __k_00 != (this->m_positional->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
            } while (bVar20);
          }
          if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length) {
            operator_delete(value.
                            super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,name._M_string_length + 1);
          }
          if (!bVar20) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parsed,
                       (char **)(arg_value.field_2._8_8_ + (long)local_34 * 8));
          }
        }
        else if (argu_desc.arg_name.field_2._M_local_buf[8] == '\x01') {
          if (argu_desc.arg_name._M_dataplus._M_p != (pointer)0x0) {
            pcVar17 = (pointer)0x0;
            do {
              uVar15 = arg_value.field_2._8_8_;
              value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length;
              std::__cxx11::string::_M_construct((ulong)text,'\x01');
              cVar12 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&this->m_options->_M_h,(key_type *)text);
              if (cVar12.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                iVar9 = 6;
                if (this->m_allow_unrecognised == false) {
                  throw_or_mimic<cxxopts::option_not_exists_exception>((string *)text);
                  uVar15 = arg_value.field_2._8_8_;
                  goto LAB_00116382;
                }
              }
              else {
LAB_00116382:
                local_a0 = *(undefined1 (*) [8])
                            ((long)cVar12.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                   ._M_cur + 0x28);
                value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = *(element_type **)
                        ((long)cVar12.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x30);
                if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    psVar2 = &((value.
                                super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_short)._M_string_length;
                    *(int *)psVar2 = (int)*psVar2 + 1;
                    UNLOCK();
                  }
                  else {
                    psVar2 = &((value.
                                super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_short)._M_string_length;
                    *(int *)psVar2 = (int)*psVar2 + 1;
                  }
                }
                if (pcVar17 + 1 == argu_desc.arg_name._M_dataplus._M_p) {
                  checked_parse_arg(this,argc,(char **)uVar15,&local_34,
                                    (shared_ptr<cxxopts::OptionDetails> *)local_a0,(string *)text);
LAB_0011657a:
                  iVar9 = 0;
                }
                else {
                  iVar9 = (*((((element_type *)local_a0)->m_value).
                             super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr)->_vptr_Value[7])();
                  if ((char)iVar9 != '\0') {
                    (*((((shared_ptr<const_cxxopts::Value> *)((long)local_a0 + 0x60))->
                       super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->_vptr_Value[9])((undefined1 *)((long)&name.field_2 + 8));
                    unmatched.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         *(pointer *)((long)local_a0 + 0x78);
                    pmVar11 = std::__detail::
                              _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                            *)pPVar1,
                                           (key_type *)
                                           &unmatched.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    peVar7 = value.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    argu_desc.value.field_2._8_8_ = local_a0;
                    if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr != (element_type *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        psVar2 = &((value.
                                    super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_short)._M_string_length;
                        *(int *)psVar2 = (int)*psVar2 + 1;
                        UNLOCK();
                      }
                      else {
                        psVar2 = &((value.
                                    super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_short)._M_string_length;
                        *(int *)psVar2 = (int)*psVar2 + 1;
                      }
                    }
                    OptionValue::ensure_value
                              (pmVar11,(shared_ptr<const_cxxopts::OptionDetails> *)
                                       ((long)&argu_desc.value.field_2 + 8));
                    pmVar11->m_count = pmVar11->m_count + 1;
                    peVar3 = (pmVar11->m_value).
                             super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    (*peVar3->_vptr_Value[3])(peVar3,(undefined1 *)((long)&name.field_2 + 8));
                    pmVar11->m_long_name = (string *)(argu_desc.value.field_2._8_8_ + 0x20);
                    if (peVar7 != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7);
                    }
                    std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                    emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                              ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)
                               this_00,(string *)((long)local_a0 + 0x20),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&name.field_2 + 8));
                    if ((size_type *)name.field_2._8_8_ != &arg_value._M_string_length) {
                      operator_delete((void *)name.field_2._8_8_,arg_value._M_string_length + 1);
                    }
                    goto LAB_0011657a;
                  }
                  if (argu_desc.arg_name._M_dataplus._M_p <= pcVar17 + 1) {
                    throw_or_mimic<cxxopts::option_requires_argument_exception>((string *)text);
                    goto LAB_0011657a;
                  }
                  std::__cxx11::string::substr((ulong)((long)&name.field_2 + 8),(ulong)auStack_f8);
                  unmatched.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       *(pointer *)((long)local_a0 + 0x78);
                  pmVar11 = std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)pPVar1,
                                         (key_type *)
                                         &unmatched.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  peVar7 = value.
                           super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  argu_desc.value.field_2._8_8_ = local_a0;
                  if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr != (element_type *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      psVar2 = &((value.
                                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_short)._M_string_length;
                      *(int *)psVar2 = (int)*psVar2 + 1;
                      UNLOCK();
                    }
                    else {
                      psVar2 = &((value.
                                  super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_short)._M_string_length;
                      *(int *)psVar2 = (int)*psVar2 + 1;
                    }
                  }
                  OptionValue::ensure_value
                            (pmVar11,(shared_ptr<const_cxxopts::OptionDetails> *)
                                     ((long)&argu_desc.value.field_2 + 8));
                  pmVar11->m_count = pmVar11->m_count + 1;
                  peVar3 = (pmVar11->m_value).
                           super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  (*peVar3->_vptr_Value[3])(peVar3,(undefined1 *)((long)&name.field_2 + 8));
                  pmVar11->m_long_name = (string *)(argu_desc.value.field_2._8_8_ + 0x20);
                  if (peVar7 != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7);
                  }
                  std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
                  emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                            ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)this_00,
                             (string *)((long)local_a0 + 0x20),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&name.field_2 + 8));
                  if ((size_type *)name.field_2._8_8_ != &arg_value._M_string_length) {
                    operator_delete((void *)name.field_2._8_8_,arg_value._M_string_length + 1);
                  }
                  iVar9 = 4;
                }
                if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             value.
                             super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
                }
              }
              if (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length) {
                operator_delete(value.
                                super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi,name._M_string_length + 1);
              }
            } while (((iVar9 == 6) || (iVar9 == 0)) &&
                    (pcVar17 = pcVar17 + 1, pcVar17 != argu_desc.arg_name._M_dataplus._M_p));
          }
        }
        else if (argu_desc.arg_name._M_dataplus._M_p != (pointer)0x0) {
          cVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this->m_options->_M_h,(key_type *)auStack_f8);
          if (cVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            if (this->m_allow_unrecognised == true) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*const&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &parsed,(char **)(uVar15 + (long)local_34 * 8));
              goto LAB_00116912;
            }
            throw_or_mimic<cxxopts::option_not_exists_exception>((string *)auStack_f8);
          }
          name.field_2._8_8_ =
               *(long *)((long)cVar12.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28);
          arg_value._M_dataplus._M_p =
               *(pointer *)
                ((long)cVar12.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                       ._M_cur + 0x30);
          if (arg_value._M_dataplus._M_p != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(arg_value._M_dataplus._M_p + 8) =
                   *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(arg_value._M_dataplus._M_p + 8) =
                   *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
            }
          }
          if (argu_desc.arg_name.field_2._M_local_buf[9] == '\x01') {
            argu_desc.value.field_2._8_8_ = *(undefined8 *)(name.field_2._8_8_ + 0x78);
            pmVar11 = std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)pPVar1,(key_type *)(argu_desc.value.field_2._M_local_buf + 8))
            ;
            value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name.field_2._8_8_;
            name._M_dataplus = arg_value._M_dataplus;
            if (arg_value._M_dataplus._M_p != (pointer)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(arg_value._M_dataplus._M_p + 8) =
                     *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(arg_value._M_dataplus._M_p + 8) =
                     *(int *)(arg_value._M_dataplus._M_p + 8) + 1;
              }
            }
            OptionValue::ensure_value(pmVar11,(shared_ptr<const_cxxopts::OptionDetails> *)text);
            pmVar11->m_count = pmVar11->m_count + 1;
            peVar3 = (pmVar11->m_value).
                     super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (*peVar3->_vptr_Value[3])(peVar3,&argu_desc.grouping);
            pmVar11->m_long_name =
                 (string *)
                 (value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 2);
            if (name._M_dataplus._M_p != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name._M_dataplus._M_p);
            }
            std::vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>>::
            emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&>
                      ((vector<cxxopts::KeyValue,std::allocator<cxxopts::KeyValue>> *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (name.field_2._8_8_ + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &argu_desc.grouping);
          }
          else {
            checked_parse_arg(this,argc,(char **)uVar15,&local_34,
                              (shared_ptr<cxxopts::OptionDetails> *)((long)&name.field_2 + 8),
                              (string *)auStack_f8);
          }
          if (arg_value._M_dataplus._M_p != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg_value._M_dataplus._M_p);
          }
        }
LAB_00116912:
        local_34 = local_34 + 1;
        if ((size_type *)argu_desc._32_8_ != &argu_desc.value._M_string_length) {
          operator_delete((void *)argu_desc._32_8_,argu_desc.value._M_string_length + 1);
        }
        if (auStack_f8 != (undefined1  [8])&argu_desc.arg_name._M_string_length) {
          operator_delete((void *)auStack_f8,argu_desc.arg_name._M_string_length + 1);
        }
        iVar9 = local_34;
        local_35 = local_34 == argc;
        cVar19 = local_35;
        if ((bool)local_35) goto LAB_00116999;
        pcVar14 = *(char **)(arg_value.field_2._8_8_ + (long)local_34 * 8);
        iVar10 = strcmp(pcVar14,"--");
      } while (iVar10 != 0);
      local_34 = iVar9 + 1;
      cVar19 = local_35;
    }
  }
LAB_00116999:
  local_35 = cVar19;
  p_Var16 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    pPVar1 = &this->m_parsed;
    do {
      p_Var4 = p_Var16[5]._M_nxt[0xc]._M_nxt;
      auStack_f8 = (undefined1  [8])p_Var16[5]._M_nxt[0xf]._M_nxt;
      pmVar11 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)pPVar1,(key_type *)auStack_f8);
      cVar19 = (*(code *)p_Var4->_M_nxt[5]._M_nxt)(p_Var4);
      if (cVar19 == '\0') {
        auStack_f8 = (undefined1  [8])p_Var16[5]._M_nxt[0xf]._M_nxt;
        pmVar11 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)pPVar1,(key_type *)auStack_f8);
        p_Var4 = p_Var16[5]._M_nxt;
        this_01._M_p = (pointer)p_Var16[6]._M_nxt;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          pmVar11->m_long_name = (string *)(p_Var4 + 4);
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p)->_M_use_count + 1;
          }
          pmVar11->m_long_name = (string *)(p_Var4 + 4);
LAB_00116a97:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01._M_p);
        }
      }
      else if ((pmVar11->m_count == 0) && (pmVar11->m_default == false)) {
        auStack_f8 = (undefined1  [8])p_Var16[5]._M_nxt[0xf]._M_nxt;
        pmVar11 = std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)pPVar1,(key_type *)auStack_f8);
        auStack_f8 = (undefined1  [8])p_Var16[5]._M_nxt;
        argu_desc.arg_name._M_dataplus._M_p = (pointer)p_Var16[6]._M_nxt;
        if ((_Hash_node_base *)argu_desc.arg_name._M_dataplus._M_p != (_Hash_node_base *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->_M_nxt =
                 *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->
                          _M_nxt + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->_M_nxt =
                 *(int *)&((_Hash_node_base *)((long)argu_desc.arg_name._M_dataplus._M_p + 8))->
                          _M_nxt + 1;
          }
        }
        OptionValue::ensure_value(pmVar11,(shared_ptr<const_cxxopts::OptionDetails> *)auStack_f8);
        pmVar11->m_default = true;
        pmVar11->m_long_name = (string *)((long)auStack_f8 + 0x20);
        (*((pmVar11->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_vptr_Value[4])();
        this_01 = argu_desc.arg_name._M_dataplus;
        if (argu_desc.arg_name._M_dataplus._M_p != (pointer)0x0) goto LAB_00116a97;
      }
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
  }
  if (local_35 == '\0') {
    if (local_34 < argc) {
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)auStack_f8,*(char **)(arg_value.field_2._8_8_ + (long)local_34 * 8),
                   (allocator<char> *)(name.field_2._M_local_buf + 8));
        bVar20 = __k_00 != (this->m_positional->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
        if (bVar20) {
          bVar20 = true;
          do {
            cVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&this->m_options->_M_h,__k_00);
            if (cVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              throw_or_mimic<cxxopts::option_not_exists_exception>(__k_00);
            }
            else {
              cVar19 = (**(code **)(**(long **)(*(long *)((long)cVar12.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                                                  ._M_cur + 0x28) + 0x60) + 0x30))();
              psVar18 = (shared_ptr<cxxopts::OptionDetails> *)
                        ((long)cVar12.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
                               ._M_cur + 0x28);
              if (cVar19 != '\0') {
                parse_option(this,psVar18,__k_00,(string *)auStack_f8);
                break;
              }
              value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((psVar18->super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->m_hash;
              pmVar11 = std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                      *)&this->m_parsed,
                                     (key_type *)
                                     &value.
                                      super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
              if (pmVar11->m_count == 0) {
                parse_option(this,psVar18,__k_00,(string *)auStack_f8);
                __k_00 = __k_00 + 1;
                break;
              }
              __k_00 = __k_00 + 1;
            }
            bVar20 = __k_00 != (this->m_positional->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
          } while (bVar20);
        }
        if (auStack_f8 != (undefined1  [8])&argu_desc.arg_name._M_string_length) {
          operator_delete((void *)auStack_f8,argu_desc.arg_name._M_string_length + 1);
        }
      } while ((bVar20) && (local_34 = local_34 + 1, local_34 < argc));
    }
    uVar15 = arg_value.field_2._8_8_;
    if (local_34 != argc) {
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parsed,
                   (char **)(uVar15 + (long)local_34 * 8));
        local_34 = local_34 + 1;
      } while (local_34 != argc);
    }
  }
  p_Var16 = (this->m_options->_M_h)._M_before_begin._M_nxt;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    do {
      __k = (key_type *)p_Var16[5]._M_nxt;
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&__k[3].field_2 + 8);
      value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = p_Var5;
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k);
      _Var8._M_pi = value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      *pmVar13 = (mapped_type)p_Var5;
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->m_keys,__k + 1);
      *pmVar13 = (mapped_type)_Var8._M_pi;
      argu_desc.arg_name._M_string_length = 0;
      argu_desc.arg_name.field_2._M_allocated_capacity = 0;
      auStack_f8 = (undefined1  [8])0x0;
      argu_desc.arg_name._M_dataplus._M_p = (pointer)0x0;
      argu_desc.arg_name.field_2._8_8_ = 0;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_long&,cxxopts::OptionValue>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,cxxopts::OptionValue>,std::allocator<std::pair<unsigned_long_const,cxxopts::OptionValue>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->m_parsed,
                 &value.super___shared_ptr<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,auStack_f8);
      if (argu_desc.arg_name._M_string_length != 0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   argu_desc.arg_name._M_string_length);
      }
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
  }
  pPVar6 = local_130;
  local_148.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_148.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_148.super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (this->m_sequential).
       super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ParseResult::ParseResult
            (local_130,&this->m_keys,&this->m_parsed,&local_148,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsed);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsed);
  return pPVar6;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  auto next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }
    bool matched = false;
    values::parser_tool::ArguDesc argu_desc =
        values::parser_tool::ParseArgument(argv[current], matched);

    if (!matched)
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.emplace_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (argu_desc.grouping)
      {
        const std::string& s = argu_desc.arg_name;

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else if (i + 1 < s.size())
          {
            std::string arg_value = s.substr(i + 1);
            parse_option(value, name, arg_value);
            break;
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (argu_desc.arg_name.length() != 0)
      {
        const std::string& name = argu_desc.arg_name;

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.emplace_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (argu_desc.set_value)
        {
          //parse the option given

          parse_option(opt, name, argu_desc.value);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if (value.has_default()) {
      if (!store.count() && !store.has_default()) {
        parse_default(detail);
      }
    }
    else {
      parse_no_value(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.emplace_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}